

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TubeResonator.cpp
# Opt level: O2

int TubeResonator::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  int enumvalue;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x600);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Num sections","",1.0,10.0,3.0,1.0,1.0,0,"Number of sections");
  RegisterParameter(definition,"Feedback","%",0.0,1.0,0.5,100.0,1.0,1,"Feedback");
  RegisterParameter(definition,"Nonlinearity","%",0.0,1.0,0.0,100.0,1.0,2,
                    "Amount of nonlinearity at reflection");
  RegisterParameter(definition,"Mike position","%",0.0,1.0,0.0,100.0,1.0,3,"Microphone position");
  enumvalue = 5;
  for (uVar4 = 1; uVar4 != 0xb; uVar4 = uVar4 + 1) {
    pcVar2 = tmpstr(0,"Length %d",(ulong)uVar4);
    pcVar3 = tmpstr(1,"Section %d length",(ulong)uVar4);
    RegisterParameter(definition,pcVar2,"cm",0.01,180.625,7.0,1.0,3.0,enumvalue + -1,pcVar3);
    pcVar2 = tmpstr(0,"Radius %d",(ulong)uVar4);
    pcVar3 = tmpstr(1,"Section %d radius",(ulong)uVar4);
    RegisterParameter(definition,pcVar2,"cm",0.01,100.0,3.0,1.0,3.0,enumvalue,pcVar3);
    enumvalue = enumvalue + 2;
  }
  return 0x18;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Num sections", "", 1.0f, MAXSECTIONS, 3.0f, 1.0f, 1.0f, P_NUMSECTIONS, "Number of sections");
        RegisterParameter(definition, "Feedback", "%", 0.0f, 1.0f, 0.5f, 100.0f, 1.0f, P_FB, "Feedback");
        RegisterParameter(definition, "Nonlinearity", "%", 0.0f, 1.0f, 0.0f, 100.0f, 1.0f, P_NL, "Amount of nonlinearity at reflection");
        RegisterParameter(definition, "Mike position", "%", 0.0f, 1.0f, 0.0f, 100.0f, 1.0f, P_MIKEPOS, "Microphone position");
        for (int n = 0; n < MAXSECTIONS; n++)
        {
            RegisterParameter(definition, tmpstr(0, "Length %d", n + 1), "cm", 0.01f, (float)Delay::MASK * (34000.0f / 48000.0f), 7.0f, 1.0f, 3.0f, P_L1 + n * 2, tmpstr(1, "Section %d length", n + 1));
            RegisterParameter(definition, tmpstr(0, "Radius %d", n + 1), "cm", 0.01f, 100.0f, 3.0f, 1.0f, 3.0f, P_A1 + n * 2, tmpstr(1, "Section %d radius", n + 1));
        }
        return numparams;
    }